

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRenderRule * __thiscall
QStyleSheetStyle::standardPixmap
          (QStyleSheetStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *w)

{
  QLatin1StringView sh;
  bool bVar1;
  QStyle *pQVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  QStyleSheetStyle *in_RSI;
  QRenderRule *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  qreal qVar3;
  QStyleOption *unaff_retaddr;
  QObject *in_stack_00000008;
  QStyleSheetStyle *in_stack_00000010;
  QIcon icon;
  QLatin1StringView s;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QVariant styleHint;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QRenderRule *pQVar4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar5;
  undefined1 local_e8 [8];
  QIcon local_e0;
  qsizetype local_d8;
  char *local_d0;
  QLatin1StringView local_c8;
  QStyleSheetStyleRecursionGuard local_b1 [137];
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RSI)) {
    pQVar2 = baseStyle((QStyleSheetStyle *)in_RDI);
    (**(code **)(*(long *)pQVar2 + 0xf8))(in_RDI,pQVar2,in_EDX,in_RCX,in_R8);
    goto LAB_0043ef06;
  }
  local_b1[0].guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(local_b1,in_RSI);
  local_c8.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_c8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8 = propertyNameForStandardPixmap((StandardPixmap)((ulong)in_RDI >> 0x20));
  bVar1 = QLatin1String::isEmpty((QLatin1String *)0x43ed75);
  if (bVar1) {
LAB_0043eec8:
    pQVar2 = baseStyle((QStyleSheetStyle *)pQVar4);
    (**(code **)(*(long *)pQVar2 + 0xf8))(in_RDI,pQVar2,in_EDX,in_RCX,in_R8);
  }
  else {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    renderRule(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)lVar6 >> 0x20));
    local_d8 = local_c8.m_size;
    local_d0 = local_c8.m_data;
    sh.m_data._0_4_ = in_stack_fffffffffffffee8;
    sh.m_size = (qsizetype)in_RSI;
    sh.m_data._4_4_ = in_stack_fffffffffffffeec;
    QRenderRule::styleHint(in_RDI,sh);
    QRenderRule::~QRenderRule(in_RDI);
    bVar1 = ::QVariant::isValid((QVariant *)in_RDI);
    if ((bVar1) && (bVar1 = ::QVariant::canConvert<QIcon>((QVariant *)in_RDI), bVar1)) {
      local_e0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      qvariant_cast<QIcon>
                ((QVariant *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      QSize::QSize((QSize *)in_RDI,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      qVar3 = QStyleHelper::getDpr((QWidget *)in_RDI);
      QIcon::pixmap((QSize *)in_RDI,qVar3,(Mode)&local_e0,(State)local_e8);
      iVar5 = 1;
      QIcon::~QIcon(&local_e0);
    }
    else {
      iVar5 = 0;
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
    if (iVar5 == 0) goto LAB_0043eec8;
  }
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(local_b1);
LAB_0043ef06:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QPixmap QStyleSheetStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                         const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->standardPixmap(standardPixmap, opt, w))
    const auto s = propertyNameForStandardPixmap(standardPixmap);
    if (!s.isEmpty()) {
        const auto styleHint = renderRule(w, opt).styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<QIcon>()) {
            QIcon icon = qvariant_cast<QIcon>(styleHint);
            return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(w));
        }
    }
    return baseStyle()->standardPixmap(standardPixmap, opt, w);
}